

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void Z80::OpCode_RST(void)

{
  byte bVar1;
  char cVar2;
  char *in_RSI;
  
  while( true ) {
    bVar1 = GetByteNoMem((char **)0x0,SUB81(in_RSI,0));
    if ((bVar1 & 199) == 0) {
      in_RSI = (char *)0x1;
      EmitByte(bVar1 | 199,true);
    }
    else {
      in_RSI = ::line;
      Error("[RST] Illegal operand",::line,PASS3);
      SkipToEol(&lp);
    }
    if ((bVar1 & 199) != 0) break;
    cVar2 = (*DAT_0018d520)();
    if (cVar2 == '\0') {
      return;
    }
  }
  return;
}

Assistant:

static void OpCode_RST() {
		do {
			byte e = GetByteNoMem(lp);
			if (e&(~0x38)) {	// some bit is set which should be not
				Error("[RST] Illegal operand", line); SkipToEol(lp);
				return;
			} else {			// e == { $00, $08, $10, $18, $20, $28, $30, $38 }
				EmitByte(0xC7 + e, true);
			}
		} while (Options::syx.MultiArg(lp));
	}